

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

void __thiscall lzham::lzcompressor::state::reset_state_partial(state *this)

{
  (this->super_state_base).m_match_hist[3] = 1;
  (this->super_state_base).m_cur_state = 0;
  (this->super_state_base).m_match_hist[0] = 1;
  (this->super_state_base).m_match_hist[1] = 1;
  (this->super_state_base).m_match_hist[2] = 1;
  return;
}

Assistant:

void lzcompressor::state::reset_state_partial()
   {
      LZHAM_ASSUME(CLZBase::cMatchHistSize == 4);
      m_match_hist[0] = 1;
      m_match_hist[1] = 1;
      m_match_hist[2] = 1;
      m_match_hist[3] = 1;
      m_cur_state = 0;
   }